

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.cpp
# Opt level: O0

EffectProps * __thiscall
anon_unknown.dwarf_13acd4::EqualizerStateFactory::getDefaultProps(EqualizerStateFactory *this)

{
  EffectProps *in_RDI;
  EffectProps *props;
  
  memset(in_RDI,0,0x6c);
  (in_RDI->Chorus).Waveform = 0x43480000;
  (in_RDI->Chorus).Phase = 0x3f800000;
  (in_RDI->Fshifter).RightDirection = 0x43fa0000;
  (in_RDI->Vmorpher).PhonemeACoarseTuning = 0x3f800000;
  (in_RDI->Vmorpher).PhonemeBCoarseTuning = 0x3f800000;
  (in_RDI->Vmorpher).Waveform = 0x453b8000;
  (in_RDI->Reverb).ReflectionsGain = 1.0;
  (in_RDI->Reverb).ReflectionsDelay = 1.0;
  (in_RDI->Reverb).LateReverbGain = 6000.0;
  (in_RDI->Reverb).LateReverbDelay = 1.0;
  return in_RDI;
}

Assistant:

EffectProps EqualizerStateFactory::getDefaultProps() const noexcept
{
    EffectProps props{};
    props.Equalizer.LowCutoff = AL_EQUALIZER_DEFAULT_LOW_CUTOFF;
    props.Equalizer.LowGain = AL_EQUALIZER_DEFAULT_LOW_GAIN;
    props.Equalizer.Mid1Center = AL_EQUALIZER_DEFAULT_MID1_CENTER;
    props.Equalizer.Mid1Gain = AL_EQUALIZER_DEFAULT_MID1_GAIN;
    props.Equalizer.Mid1Width = AL_EQUALIZER_DEFAULT_MID1_WIDTH;
    props.Equalizer.Mid2Center = AL_EQUALIZER_DEFAULT_MID2_CENTER;
    props.Equalizer.Mid2Gain = AL_EQUALIZER_DEFAULT_MID2_GAIN;
    props.Equalizer.Mid2Width = AL_EQUALIZER_DEFAULT_MID2_WIDTH;
    props.Equalizer.HighCutoff = AL_EQUALIZER_DEFAULT_HIGH_CUTOFF;
    props.Equalizer.HighGain = AL_EQUALIZER_DEFAULT_HIGH_GAIN;
    return props;
}